

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O2

int __thiscall Settings::extraArgumentChecks(Settings *this)

{
  ostream *poVar1;
  size_t i;
  size_t sVar2;
  ulong uVar3;
  
  if (this->nDecomp == 0 && 1 < this->nProc) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "ERROR : Missing decomposition for parallel program (see -d option)");
  }
  else {
    uVar3 = 1;
    for (sVar2 = 0; this->nDecomp != sVar2; sVar2 = sVar2 + 1) {
      uVar3 = uVar3 * (this->processDecomp).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start[sVar2];
    }
    if (uVar3 == this->nProc) {
      return 0;
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"ERROR : Product of decomposition values = ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1," must equal the number of processes = ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  std::endl<char,std::char_traits<char>>(poVar1);
  return 1;
}

Assistant:

int Settings::extraArgumentChecks()
{
    if (!nDecomp && nProc > 1)
    {
        std::cout << "ERROR : Missing decomposition for parallel program (see "
                     "-d option)"
                  << std::endl;
        return 1;
    }

    size_t N = 1;
    for (size_t i = 0; i < nDecomp; ++i)
    {
        N *= processDecomp[i];
    }

    if (N != nProc)
    {
        std::cout << "ERROR : Product of decomposition values = " << N
                  << " must equal the number of processes = " << nProc << std::endl;
        return 1;
    }
    return 0;
}